

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::SetEnumerable
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  bool bVar1;
  uint16 uVar2;
  PropertyIndex propertyIndex_00;
  int iVar3;
  BOOL BVar4;
  DynamicTypeHandler *pDVar5;
  TypePath *this_00;
  ScriptContext *pSVar6;
  PropertyRecord *this_01;
  undefined4 extraout_var;
  PropertyRecord *propertyRecord;
  PropertyIndex propertyIndex;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  if (value == 0) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareTypesWithAttributesPhase);
    if (bVar1) {
      pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      pSVar6->convertPathToDictionaryAttributesCount =
           pSVar6->convertPathToDictionaryAttributesCount + 1;
      uVar2 = GetPathLength(this);
      pDVar5 = TryConvertToSimpleDictionaryType(this,instance,(uint)uVar2,false);
      this_local._4_4_ =
           (*pDVar5->_vptr_DynamicTypeHandler[0x29])(pDVar5,instance,(ulong)(uint)propertyId,0);
    }
    else {
      this_00 = GetTypePath(this);
      uVar2 = GetPathLength(this);
      propertyIndex_00 = TypePath::LookupInline(this_00,propertyId,(uint)uVar2);
      if (propertyIndex_00 == 0xffff) {
        bVar1 = DynamicObject::HasObjectArray(instance);
        if (bVar1) {
          pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
          this_01 = ScriptContext::GetPropertyName(pSVar6,propertyId);
          bVar1 = PropertyRecord::IsNumeric(this_01);
          if (bVar1) {
            iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])
                              (this,instance);
            BVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x148))
                              ((long *)CONCAT44(extraout_var,iVar3),instance,propertyId,0);
            return BVar4;
          }
        }
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ =
             SetAttributesHelper(this,instance,propertyId,propertyIndex_00,
                                 (ObjectSlotAttributes *)0x0,
                                 ObjectSlotAttr_Writable|ObjectSlotAttr_Configurable,false);
      }
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (value)
        {
            return true;
        }

        if (PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif
            return TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetEnumerable(instance, propertyId, value);
        }

        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray())
            {
                PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                if (propertyRecord->IsNumeric())
                {
                    return ConvertToTypeWithItemAttributes(instance)->SetEnumerable(instance, propertyId, value);
                }
            }
            return true;
        }

        return SetAttributesHelper(instance, propertyId, propertyIndex, nullptr, (ObjectSlotAttributes)(ObjectSlotAttr_Default & ~ObjectSlotAttr_Enumerable));
    }